

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall IteratorTest::accessIteratorOperations<false>(IteratorTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  allocator<TestType> *paVar3;
  bool bVar4;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  reference piVar8;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *this_00;
  reference piVar9;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar10;
  pointer pTVar11;
  pointer pTVar12;
  bool local_d4a;
  bool local_d12;
  bool local_cda;
  iterator local_ba8;
  bool local_b76;
  bool local_b75;
  int local_b74;
  undefined1 local_b70 [4];
  int i_5;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_b40;
  undefined1 local_b10 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_8;
  undefined1 local_ac8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_a80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  bool local_a36;
  bool local_a35;
  int local_a34;
  undefined1 local_a30 [4];
  int i_4;
  undefined1 local_a00 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_7;
  undefined1 local_9b8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_970 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  bool local_926;
  bool local_925;
  int local_924;
  undefined1 local_920 [4];
  int i_3;
  undefined1 local_8f0 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it_6;
  undefined1 local_8a8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_860 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  ulong local_840;
  size_t j_5;
  undefined1 local_808 [8];
  Iterator<TestType,_true,_std::allocator<unsigned_long>_> it_5;
  undefined1 local_7c0 [8];
  View<TestType,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_778 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  size_t j_4;
  TestType data_2 [24];
  ulong local_690;
  size_t j_3;
  Iterator<TestType,_true,_std::allocator<unsigned_long>_> it_4;
  undefined1 local_640 [8];
  View<TestType,_true,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_5f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  size_t j_2;
  TestType data_1 [24];
  ulong local_510;
  size_t j_1;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> it_3;
  undefined1 local_4c0 [8];
  View<TestType,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_478 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  size_t j;
  TestType data [24];
  iterator local_390;
  bool local_35e;
  bool local_35d;
  int local_35c;
  undefined1 local_358 [4];
  int i_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_328;
  undefined1 local_2f8 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_2;
  undefined1 local_2b0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_268 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  const_iterator local_248;
  bool local_216;
  bool local_215;
  int local_214;
  undefined1 local_210 [4];
  int i_1;
  undefined1 local_1e0 [8];
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_1;
  undefined1 local_198 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_150 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  iterator local_130;
  bool local_fe;
  bool local_fd;
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  undefined1 local_c8 [8];
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  IteratorTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  for (local_fc = 0; local_fc < 0x18; local_fc = local_fc + 1) {
    piVar8 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
    local_fd = *piVar8 == this->data_[local_fc];
    test(&local_fd);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_130,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_fe = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,false,std::allocator<unsigned_long>> *)local_c8,&local_130);
  test(&local_fe);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_130);
  this_00 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  piVar8 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(this_00);
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0x2e;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  paVar1 = (allocator<int> *)
           ((long)&it_1.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_198,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_1.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_210,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_198);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e0,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_210);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_210);
  for (local_214 = 0; local_214 < 0x18; local_214 = local_214 + 1) {
    piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e0);
    local_215 = *piVar9 == this->data_[local_214];
    test(&local_215);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e0);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end
            (&local_248,(View<int,_true,_std::allocator<unsigned_long>_> *)local_198);
  local_216 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_1e0,&local_248);
  test(&local_216);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_248);
  pIVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e0);
  piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar10);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar9 == 0x2e;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_1e0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_198);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  paVar1 = (allocator<int> *)
           ((long)&it_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_2b0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_358,(View<int,_false,_std::allocator<unsigned_long>_> *)local_2b0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_328,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_358);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8,&local_328);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_328);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_358);
  for (local_35c = 0; local_35c < 0x18; local_35c = local_35c + 1) {
    piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
    local_35d = *piVar9 == this->data_[local_35c];
    test(&local_35d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_390,(View<int,_false,_std::allocator<unsigned_long>_> *)local_2b0);
  local_35e = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_2f8,&local_390);
  test(&local_35e);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_390);
  pIVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar10);
  data[0x17].data_._7_1_ = *piVar9 == 0x2e;
  test((bool *)((long)&data[0x17].data_ + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  for (shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0x18;
      shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    data[(long)shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + -1].data_ =
         (size_t)shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  }
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478);
  paVar3 = (allocator<TestType> *)
           ((long)&it_3.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<TestType>::allocator(paVar3);
  andres::View<TestType,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<TestType,false,std::allocator<unsigned_long>> *)local_4c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,(pointer)&j,&andres::defaultOrder,&andres::defaultOrder,paVar3);
  std::allocator<TestType>::~allocator
            ((allocator<TestType> *)
             ((long)&it_3.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::View<TestType,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&j_1,(View<TestType,_false,_std::allocator<unsigned_long>_> *)local_4c0);
  for (local_510 = 0; local_510 < 0x18; local_510 = local_510 + 1) {
    pTVar11 = andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::operator->
                        ((Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)&j_1);
    data_1[0x17].data_._7_1_ = pTVar11->data_ == local_510;
    test((bool *)((long)&data_1[0x17].data_ + 7));
    andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)&j_1);
  }
  andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)&j_1);
  andres::View<TestType,_false,_std::allocator<unsigned_long>_>::~View
            ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_4c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478);
  for (shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0x18;
      shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    data_1[(long)shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + -1].data_ =
         (size_t)shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  }
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5f8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5f8,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5f8);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5f8);
  paVar3 = (allocator<TestType> *)
           ((long)&it_4.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<TestType>::allocator(paVar3);
  andres::View<TestType,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<TestType,true,std::allocator<unsigned_long>> *)local_640,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,(pointer)&j_2,&andres::defaultOrder,&andres::defaultOrder,paVar3);
  std::allocator<TestType>::~allocator
            ((allocator<TestType> *)
             ((long)&it_4.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::View<TestType,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&j_3,
             (View<TestType,_true,_std::allocator<unsigned_long>_> *)local_640);
  for (local_690 = 0; local_690 < 0x18; local_690 = local_690 + 1) {
    pTVar12 = andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator->
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&j_3);
    data_2[0x17].data_._7_1_ = pTVar12->data_ == local_690;
    test((bool *)((long)&data_2[0x17].data_ + 7));
    andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&j_3);
  }
  andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)&j_3);
  andres::View<TestType,_true,_std::allocator<unsigned_long>_>::~View
            ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_640);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5f8);
  for (shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0x18;
      shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    data_2[(long)shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + -1].data_ =
         (size_t)shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  }
  puVar2 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778);
  paVar3 = (allocator<TestType> *)
           ((long)&it_5.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<TestType>::allocator(paVar3);
  andres::View<TestType,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<TestType,false,std::allocator<unsigned_long>> *)local_7c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,(pointer)&j_4,&andres::defaultOrder,&andres::defaultOrder,paVar3);
  std::allocator<TestType>::~allocator
            ((allocator<TestType> *)
             ((long)&it_5.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::View<TestType,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&j_5,(View<TestType,_false,_std::allocator<unsigned_long>_> *)local_7c0);
  andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_808,
             (Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)&j_5);
  andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)&j_5);
  for (local_840 = 0; local_840 < 0x18; local_840 = local_840 + 1) {
    pTVar12 = andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator->
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_808);
    shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = pTVar12->data_ == local_840;
    test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_808);
  }
  andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_808);
  andres::View<TestType,_false,_std::allocator<unsigned_long>_>::~View
            ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_7c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_778);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  paVar1 = (allocator<int> *)
           ((long)&it_6.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_8a8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_6.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_8f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_920,(View<int,_false,_std::allocator<unsigned_long>_> *)local_8a8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_8f0,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_920);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_920);
  for (local_924 = 0; local_924 < 0x18; local_924 = local_924 + 1) {
    piVar8 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_8f0,
                        (long)local_924);
    local_925 = *piVar8 == this->data_[local_924];
    test(&local_925);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)
             &shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_8a8);
  bVar4 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,false,std::allocator<unsigned_long>> *)local_8f0,
                     (Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                     &shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_cda = false;
  if (bVar4) {
    piVar8 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_8f0,4);
    local_cda = false;
    if (*piVar8 == this->data_[4]) {
      piVar8 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator[]
                         ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_8f0,0x10);
      local_cda = *piVar8 == this->data_[0x10];
    }
  }
  local_926 = local_cda;
  test(&local_926);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
             &shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_8f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  puVar2 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_970,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_970,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_970);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_970);
  paVar1 = (allocator<int> *)
           ((long)&it_7.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_9b8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_7.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a00);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)local_a30,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_9b8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a00,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a30);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a30);
  for (local_a34 = 0; local_a34 < 0x18; local_a34 = local_a34 + 1) {
    piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a00,
                        (long)local_a34);
    local_a35 = *piVar9 == this->data_[local_a34];
    test(&local_a35);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)
             &shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_9b8);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_a00,
                     (Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                     &shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_d12 = false;
  if (bVar4) {
    piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a00,4);
    local_d12 = false;
    if (*piVar9 == this->data_[4]) {
      piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                         ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a00,0x10);
      local_d12 = *piVar9 == this->data_[0x10];
    }
  }
  local_a36 = local_d12;
  test(&local_a36);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
             &shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_a00);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_9b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_970);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a80,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a80,0);
  *pvVar5 = 0x18;
  iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a80);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a80);
  paVar1 = (allocator<int> *)
           ((long)&it_8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_ac8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar6._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_b10);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_b70,(View<int,_false,_std::allocator<unsigned_long>_> *)local_ac8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_b40,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b70);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_b10,&local_b40);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_b40);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_b70);
  for (local_b74 = 0; local_b74 < 0x18; local_b74 = local_b74 + 1) {
    piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_b10,
                        (long)local_b74);
    local_b75 = *piVar9 == this->data_[local_b74];
    test(&local_b75);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            (&local_ba8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_ac8);
  bVar4 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                    ((Iterator<int,true,std::allocator<unsigned_long>> *)local_b10,&local_ba8);
  local_d4a = false;
  if (bVar4) {
    piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_b10,4);
    local_d4a = false;
    if (*piVar9 == this->data_[4]) {
      piVar9 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator[]
                         ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_b10,0x10);
      local_d4a = *piVar9 == this->data_[0x10];
    }
  }
  local_b76 = local_d4a;
  test(&local_b76);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_ba8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_b10);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_ac8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a80);
  return;
}

Assistant:

void IteratorTest::accessIteratorOperations() {
    // operator*
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator->
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, constTarget> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, constTarget> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<TestType, true> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, false> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    // operator[]
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
}